

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O0

void mpr_add_addr_node_to_set(avl_tree *set,netaddr addr,uint32_t offset)

{
  uint8_t *puVar1;
  long local_40;
  addr_node *tmp_node;
  uint32_t offset_local;
  avl_tree *set_local;
  
  local_40 = avl_find(set);
  if (local_40 == 0) {
    local_40 = 0;
  }
  else {
    local_40 = local_40 + -0x18;
  }
  if (local_40 == 0) {
    puVar1 = (uint8_t *)calloc(1,0x58);
    *(undefined8 *)puVar1 = addr._addr._0_8_;
    *(undefined8 *)(puVar1 + 8) = addr._addr._8_8_;
    puVar1[0x10] = addr._type;
    puVar1[0x11] = addr._prefix_len;
    *(uint8_t **)(puVar1 + 0x40) = puVar1;
    *(uint32_t *)(puVar1 + 0x50) = offset;
    avl_insert(set,puVar1 + 0x18);
  }
  return;
}

Assistant:

void
mpr_add_addr_node_to_set(struct avl_tree *set, const struct netaddr addr, uint32_t offset) {
  struct addr_node *tmp_node;

  tmp_node = avl_find_element(set, &addr, tmp_node, _avl_node);
  if (tmp_node) {
    return;
  }
  tmp_node = calloc(1, sizeof(struct addr_node));
  tmp_node->addr = addr;
  tmp_node->_avl_node.key = &tmp_node->addr;
  tmp_node->table_offset = offset;
  avl_insert(set, &tmp_node->_avl_node);
}